

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brng.c
# Opt level: O0

void brngCTRStepR(void *buf,size_t count,void *state)

{
  octet *count_00;
  octet *hash;
  size_t sVar1;
  octet *buf_00;
  octet *in_RDX;
  ulong in_RSI;
  octet *in_RDI;
  brng_ctr_st *s;
  undefined7 in_stack_ffffffffffffffa8;
  octet in_stack_ffffffffffffffaf;
  octet *in_stack_ffffffffffffffb0;
  size_t in_stack_ffffffffffffffb8;
  void *in_stack_ffffffffffffffc0;
  ulong local_10;
  octet *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  if (*(long *)(in_RDX + 0x60) != 0) {
    if (in_RSI <= *(ulong *)(in_RDX + 0x60)) {
      memCopy(in_stack_ffffffffffffffb0,
              (void *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),0x16cc47);
      *(ulong *)(in_RDX + 0x60) = *(long *)(in_RDX + 0x60) - in_RSI;
      return;
    }
    memCopy(in_stack_ffffffffffffffb0,
            (void *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),0x16cc8f);
    local_10 = in_RSI - *(long *)(in_RDX + 0x60);
    local_8 = in_RDI + *(long *)(in_RDX + 0x60);
    in_RDX[0x60] = '\0';
    in_RDX[0x61] = '\0';
    in_RDX[0x62] = '\0';
    in_RDX[99] = '\0';
    in_RDX[100] = '\0';
    in_RDX[0x65] = '\0';
    in_RDX[0x66] = '\0';
    in_RDX[0x67] = '\0';
  }
  for (; 0x1f < local_10; local_10 = local_10 - 0x20) {
    beltHash_keep();
    beltHash_keep();
    memCopy(in_stack_ffffffffffffffb0,
            (void *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),0x16cd1f);
    beltHashStepH(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    beltHashStepH(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    beltHashStepH(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    beltHashStepG(in_stack_ffffffffffffffb0,
                  (void *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
    brngBlockInc(in_RDX);
    brngBlockXor2(in_RDX + 0x20,local_8);
    local_8 = local_8 + 0x20;
  }
  if (local_10 != 0) {
    memSet(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffaf,0x16cde7);
    count_00 = in_RDX + 0x68;
    hash = in_RDX + 0x68;
    sVar1 = beltHash_keep();
    buf_00 = hash + sVar1;
    beltHash_keep();
    memCopy(hash,(void *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),0x16ce33);
    beltHashStepH(buf_00,(size_t)count_00,hash);
    beltHashStepH(buf_00,(size_t)count_00,hash);
    beltHashStepH(buf_00,(size_t)count_00,hash);
    beltHashStepH(buf_00,(size_t)count_00,hash);
    beltHashStepG(hash,(void *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
    memCopy(hash,(void *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),0x16ced4);
    brngBlockInc(in_RDX);
    brngBlockXor2(in_RDX + 0x20,in_RDX + 0x40);
    *(ulong *)(in_RDX + 0x60) = 0x20 - local_10;
  }
  return;
}

Assistant:

void brngCTRStepR(void* buf, size_t count, void* state)
{
	brng_ctr_st* s = (brng_ctr_st*)state;
	ASSERT(memIsDisjoint2(buf, count, s, brngCTR_keep()));
	// есть резерв данных?
	if (s->reserved)
	{
		if (s->reserved >= count)
		{
			memCopy(buf, s->block + 32 - s->reserved, count);
			s->reserved -= count;
			return;
		}
		memCopy(buf, s->block + 32 - s->reserved, s->reserved);
		count -= s->reserved;
		buf = (octet*)buf + s->reserved;
		s->reserved = 0;
	}
	// цикл по полным блокам
	while (count >= 32)
	{
		// Y_t <- belt-hash(key || s || X_t || r)
		memCopy(s->state_ex, s->state_ex + beltHash_keep(), beltHash_keep());
		beltHashStepH(s->s, 32, s->state_ex);
		beltHashStepH(buf, 32, s->state_ex);
		beltHashStepH(s->r, 32, s->state_ex);
		beltHashStepG(buf, s->state_ex);
		// next
		brngBlockInc(s->s);
		brngBlockXor2(s->r, buf);
		buf = (octet*)buf + 32;
		count -= 32;
	}
	// неполный блок?
	if (count)
	{
		// block <- beltHash(key || s || zero_pad(X_t) || r)
		memSetZero(s->block + count, 32 - count);
		memCopy(s->state_ex, s->state_ex + beltHash_keep(), beltHash_keep());
		beltHashStepH(s->s, 32, s->state_ex);
		beltHashStepH(buf, count, s->state_ex);
		beltHashStepH(s->block + count, 32 - count, s->state_ex);
		beltHashStepH(s->r, 32, s->state_ex);
		beltHashStepG(s->block, s->state_ex);
		// Y_t <- left(block)
		memCopy(buf, s->block, count);
		// next
		brngBlockInc(s->s);
		brngBlockXor2(s->r, s->block);
		s->reserved = 32 - count;
	}
}